

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O0

int flush_header(FILE *output_file_ptr)

{
  int iVar1;
  size_t sVar2;
  size_t bytesWritten;
  FILE *pFStack_18;
  first_byte_union first_byte;
  FILE *output_file_ptr_local;
  
  bytesWritten._7_1_ = first_byte_written;
  pFStack_18 = (FILE *)output_file_ptr;
  iVar1 = get_available_bits((long)out_bit_idx);
  bytesWritten._7_1_ = bytesWritten._7_1_ & 0x1f | (char)iVar1 << 5;
  fputc((uint)bytesWritten._7_1_,pFStack_18);
  iVar1 = fseek(pFStack_18,0,0);
  if (iVar1 == 0) {
    sVar2 = fwrite((void *)((long)&bytesWritten + 7),1,1,pFStack_18);
    if (sVar2 == 0) {
      perror("failed to overwrite first byte");
      output_file_ptr_local._4_4_ = 1;
    }
    else {
      output_file_ptr_local._4_4_ = 0;
    }
  }
  else {
    perror("error moving file ptr to beginning");
    output_file_ptr_local._4_4_ = 1;
  }
  return output_file_ptr_local._4_4_;
}

Assistant:

int flush_header(FILE* output_file_ptr) {
#ifdef _DEBUG
    log_trace("flush_header", "old_bits=");
    log_trace_char_bin(first_byte_written);
#endif

    first_byte_union first_byte;
    first_byte.raw = first_byte_written;
    first_byte.split.header = (byte_t)get_available_bits(out_bit_idx);

#ifdef _DEBUG
    log_trace("flush_header", "new_bits=");
    log_trace_char_bin(first_byte.raw);
#endif

    fputc(first_byte.raw, output_file_ptr);

    if ( fseek(output_file_ptr, 0L, SEEK_SET) != 0 ) {
        perror("error moving file ptr to beginning");
        return RC_FAIL;
    }

    size_t bytesWritten = fwrite(&first_byte.raw, sizeof(byte_t), 1, output_file_ptr);
    if(bytesWritten == 0) {
        perror("failed to overwrite first byte");
        return RC_FAIL;
    }

    return RC_OK;
}